

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O1

bool __thiscall ExecutorX86::Initialize(ExecutorX86 *this)

{
  int iVar1;
  int iVar2;
  CodeGenRegVmCallStackEntry *dst;
  uint *dst_00;
  char *dst_01;
  RegVmRegister *dst_02;
  void *__addr;
  long lVar3;
  
  NULLC::cgFuncs._0_8_ = GenCodeCmdNop;
  NULLC::cgFuncs._8_8_ = GenCodeCmdLoadByte;
  NULLC::cgFuncs._16_8_ = GenCodeCmdLoadWord;
  NULLC::cgFuncs._24_8_ = GenCodeCmdLoadDword;
  NULLC::cgFuncs._32_8_ = GenCodeCmdLoadLong;
  NULLC::cgFuncs._40_8_ = GenCodeCmdLoadFloat;
  NULLC::cgFuncs._48_8_ = GenCodeCmdLoadDouble;
  NULLC::cgFuncs._56_8_ = GenCodeCmdLoadImm;
  NULLC::cgFuncs._64_8_ = GenCodeCmdStoreByte;
  NULLC::cgFuncs._72_8_ = GenCodeCmdStoreWord;
  NULLC::cgFuncs._80_8_ = GenCodeCmdStoreDword;
  NULLC::cgFuncs._88_8_ = GenCodeCmdStoreLong;
  NULLC::cgFuncs._96_8_ = GenCodeCmdStoreFloat;
  NULLC::cgFuncs._104_8_ = GenCodeCmdStoreDouble;
  NULLC::cgFuncs._112_8_ = GenCodeCmdCombinedd;
  NULLC::cgFuncs._120_8_ = GenCodeCmdBreakupdd;
  NULLC::cgFuncs._128_8_ = GenCodeCmdMov;
  NULLC::cgFuncs._136_8_ = GenCodeCmdMovMult;
  NULLC::cgFuncs._144_8_ = GenCodeCmdDtoi;
  NULLC::cgFuncs._152_8_ = GenCodeCmdDtol;
  NULLC::cgFuncs._160_8_ = GenCodeCmdDtof;
  NULLC::cgFuncs._168_8_ = GenCodeCmdItod;
  NULLC::cgFuncs._176_8_ = GenCodeCmdLtod;
  NULLC::cgFuncs._184_8_ = GenCodeCmdItol;
  NULLC::cgFuncs._192_8_ = GenCodeCmdLtoi;
  NULLC::cgFuncs._200_8_ = GenCodeCmdIndex;
  NULLC::cgFuncs._208_8_ = GenCodeCmdGetAddr;
  NULLC::cgFuncs._216_8_ = GenCodeCmdSetRange;
  NULLC::cgFuncs._224_8_ = GenCodeCmdMemCopy;
  NULLC::cgFuncs._232_8_ = GenCodeCmdJmp;
  NULLC::cgFuncs._240_8_ = GenCodeCmdJmpz;
  NULLC::cgFuncs._248_8_ = GenCodeCmdJmpnz;
  NULLC::cgFuncs._256_8_ = GenCodeCmdCall;
  NULLC::cgFuncs._264_8_ = GenCodeCmdCallPtr;
  NULLC::cgFuncs._272_8_ = GenCodeCmdReturn;
  NULLC::cgFuncs._280_8_ = GenCodeCmdAddImm;
  NULLC::cgFuncs._288_8_ = GenCodeCmdAdd;
  NULLC::cgFuncs._296_8_ = GenCodeCmdSub;
  NULLC::cgFuncs._304_8_ = GenCodeCmdMul;
  NULLC::cgFuncs._312_8_ = GenCodeCmdDiv;
  NULLC::cgFuncs._320_8_ = GenCodeCmdPow;
  NULLC::cgFuncs._328_8_ = GenCodeCmdMod;
  NULLC::cgFuncs._336_8_ = GenCodeCmdLess;
  NULLC::cgFuncs._344_8_ = GenCodeCmdGreater;
  NULLC::cgFuncs._352_8_ = GenCodeCmdLequal;
  NULLC::cgFuncs._360_8_ = GenCodeCmdGequal;
  NULLC::cgFuncs._368_8_ = GenCodeCmdEqual;
  NULLC::cgFuncs._376_8_ = GenCodeCmdNequal;
  NULLC::cgFuncs._384_8_ = GenCodeCmdShl;
  NULLC::cgFuncs._392_8_ = GenCodeCmdShr;
  NULLC::cgFuncs._400_8_ = GenCodeCmdBitAnd;
  NULLC::cgFuncs._408_8_ = GenCodeCmdBitOr;
  NULLC::cgFuncs._416_8_ = GenCodeCmdBitXor;
  NULLC::cgFuncs._424_8_ = GenCodeCmdAddImml;
  NULLC::cgFuncs._432_8_ = GenCodeCmdAddl;
  NULLC::cgFuncs._440_8_ = GenCodeCmdSubl;
  NULLC::cgFuncs._448_8_ = GenCodeCmdMull;
  NULLC::cgFuncs._456_8_ = GenCodeCmdDivl;
  NULLC::cgFuncs._464_8_ = GenCodeCmdPowl;
  NULLC::cgFuncs._472_8_ = GenCodeCmdModl;
  NULLC::cgFuncs._480_8_ = GenCodeCmdLessl;
  NULLC::cgFuncs._488_8_ = GenCodeCmdGreaterl;
  NULLC::cgFuncs._496_8_ = GenCodeCmdLequall;
  NULLC::cgFuncs._504_8_ = GenCodeCmdGequall;
  NULLC::cgFuncs._512_8_ = GenCodeCmdEquall;
  NULLC::cgFuncs._520_8_ = GenCodeCmdNequall;
  NULLC::cgFuncs._528_8_ = GenCodeCmdShll;
  NULLC::cgFuncs._536_8_ = GenCodeCmdShrl;
  NULLC::cgFuncs._544_8_ = GenCodeCmdBitAndl;
  NULLC::cgFuncs._552_8_ = GenCodeCmdBitOrl;
  NULLC::cgFuncs._560_8_ = GenCodeCmdBitXorl;
  NULLC::cgFuncs._568_8_ = GenCodeCmdAddd;
  NULLC::cgFuncs._576_8_ = GenCodeCmdSubd;
  NULLC::cgFuncs._584_8_ = GenCodeCmdMuld;
  NULLC::cgFuncs._592_8_ = GenCodeCmdDivd;
  NULLC::cgFuncs._600_8_ = GenCodeCmdAddf;
  NULLC::cgFuncs._608_8_ = GenCodeCmdSubf;
  NULLC::cgFuncs._616_8_ = GenCodeCmdMulf;
  NULLC::cgFuncs._624_8_ = GenCodeCmdDivf;
  NULLC::cgFuncs._632_8_ = GenCodeCmdPowd;
  NULLC::cgFuncs._640_8_ = GenCodeCmdModd;
  NULLC::cgFuncs._648_8_ = GenCodeCmdLessd;
  NULLC::cgFuncs._656_8_ = GenCodeCmdGreaterd;
  NULLC::cgFuncs._664_8_ = GenCodeCmdLequald;
  NULLC::cgFuncs._672_8_ = GenCodeCmdGequald;
  NULLC::cgFuncs._680_8_ = GenCodeCmdEquald;
  NULLC::cgFuncs._688_8_ = GenCodeCmdNequald;
  NULLC::cgFuncs._696_8_ = GenCodeCmdNeg;
  NULLC::cgFuncs._704_8_ = GenCodeCmdNegl;
  NULLC::cgFuncs._712_8_ = GenCodeCmdNegd;
  NULLC::cgFuncs._720_8_ = GenCodeCmdBitNot;
  NULLC::cgFuncs._728_8_ = GenCodeCmdBitNotl;
  NULLC::cgFuncs._736_8_ = GenCodeCmdLogNot;
  NULLC::cgFuncs._744_8_ = GenCodeCmdLogNotl;
  NULLC::cgFuncs._752_8_ = GenCodeCmdConvertPtr;
  iVar1 = x86PUSH(this->codeLaunchHeader,rEBP);
  iVar2 = x86PUSH(this->codeLaunchHeader + iVar1,rEBX);
  lVar3 = (long)iVar1 + (long)iVar2;
  iVar1 = x86PUSH(this->codeLaunchHeader + lVar3,rEDI);
  lVar3 = (long)iVar1 + lVar3 + 0x4b8;
  iVar1 = x86PUSH(this->codeLaunchHeader + lVar3 + -0x4b8,rESI);
  lVar3 = iVar1 + lVar3;
  iVar1 = x86PUSH(this->codeLaunchHeader + lVar3 + -0x4b8,rR12);
  lVar3 = iVar1 + lVar3;
  iVar1 = x86PUSH(this->codeLaunchHeader + lVar3 + -0x4b8,rR13);
  lVar3 = iVar1 + lVar3;
  iVar1 = x86PUSH(this->codeLaunchHeader + lVar3 + -0x4b8,rR14);
  lVar3 = iVar1 + lVar3;
  iVar1 = x86PUSH(this->codeLaunchHeader + lVar3 + -0x4b8,rR15);
  lVar3 = iVar1 + lVar3;
  iVar1 = x64SUB(this->codeLaunchHeader + lVar3 + -0x4b8,rESP,0x28);
  lVar3 = iVar1 + lVar3;
  iVar1 = x64MOV(this->codeLaunchHeader + lVar3 + -0x4b8,rEBX,rESI);
  lVar3 = iVar1 + lVar3;
  iVar1 = x64MOV(this->codeLaunchHeader + lVar3 + -0x4b8,rR13,(unsigned_long_long)&this->vmState);
  lVar3 = iVar1 + lVar3;
  iVar1 = x86MOV(this->codeLaunchHeader + lVar3 + -0x4b8,rR15,sQWORD,rNONE,1,rR13,0x108);
  lVar3 = iVar1 + lVar3;
  iVar1 = x86MOV(this->codeLaunchHeader + lVar3 + -0x4b8,rR14,sQWORD,rNONE,1,rR13,0x180);
  lVar3 = iVar1 + lVar3;
  iVar1 = x86MOV(this->codeLaunchHeader + lVar3 + -0x4b8,rEAX,sQWORD,rNONE,1,rR13,0x100);
  lVar3 = iVar1 + lVar3;
  iVar1 = x86MOV(this->codeLaunchHeader + lVar3 + -0x4b8,sQWORD,rNONE,1,rEBX,0,rEAX);
  lVar3 = iVar1 + lVar3;
  iVar1 = x86CALL(this->codeLaunchHeader + lVar3 + -0x4b8,rEDI);
  lVar3 = iVar1 + lVar3;
  iVar1 = x64ADD(this->codeLaunchHeader + lVar3 + -0x4b8,rESP,0x28);
  lVar3 = iVar1 + lVar3;
  iVar1 = x86POP(this->codeLaunchHeader + lVar3 + -0x4b8,rR15);
  lVar3 = iVar1 + lVar3;
  iVar1 = x86POP(this->codeLaunchHeader + lVar3 + -0x4b8,rR14);
  lVar3 = iVar1 + lVar3;
  iVar1 = x86POP(this->codeLaunchHeader + lVar3 + -0x4b8,rR13);
  lVar3 = iVar1 + lVar3;
  iVar1 = x86POP(this->codeLaunchHeader + lVar3 + -0x4b8,rR12);
  lVar3 = iVar1 + lVar3;
  iVar1 = x86POP(this->codeLaunchHeader + lVar3 + -0x4b8,rESI);
  lVar3 = iVar1 + lVar3;
  iVar1 = x86POP(this->codeLaunchHeader + lVar3 + -0x4b8,rEDI);
  lVar3 = iVar1 + lVar3;
  iVar1 = x86POP(this->codeLaunchHeader + lVar3 + -0x4b8,rEBX);
  lVar3 = iVar1 + lVar3;
  iVar1 = x86POP(this->codeLaunchHeader + lVar3 + -0x4b8,rEBP);
  lVar3 = iVar1 + lVar3;
  iVar1 = x86RET(this->codeLaunchHeader + lVar3 + -0x4b8);
  lVar3 = iVar1 + lVar3;
  if (lVar3 < 0x14b9) {
    this->codeLaunchHeaderLength = (int)lVar3 - 0x4b8;
    __addr = (void *)(((ulong)(this->codeLaunchHeader + 0xfff) & 0xfffffffffffff000) - 0x1000);
    mprotect(__addr,((ulong)(this[1].codeLaunchHeader + 0xa97) & 0xfffffffffffff000) - (long)__addr,
             7);
    if ((this->vmState).callStackBase == (CodeGenRegVmCallStackEntry *)0x0) {
      dst = (CodeGenRegVmCallStackEntry *)(*(code *)NULLC::alloc)(0x4000);
      (this->vmState).callStackBase = dst;
      NULLC::fillMemory(dst,0,0x2000);
      (this->vmState).callStackEnd = (this->vmState).callStackBase + 0x800;
    }
    if ((this->vmState).tempStackArrayBase == (uint *)0x0) {
      dst_00 = (uint *)(*(code *)NULLC::alloc)(0x10000);
      (this->vmState).tempStackArrayBase = dst_00;
      NULLC::fillMemory(dst_00,0,0x10000);
      (this->vmState).tempStackArrayEnd = (this->vmState).tempStackArrayBase + 0x4000;
    }
    if ((this->vmState).dataStackBase == (char *)0x0) {
      dst_01 = (char *)(*(code *)NULLC::alloc)(this->minStackSize + 0x2000);
      (this->vmState).dataStackBase = dst_01;
      NULLC::fillMemory(dst_01,0,(ulong)this->minStackSize);
      (this->vmState).dataStackEnd = (this->vmState).dataStackBase + this->minStackSize;
    }
    if ((this->vmState).regFileArrayBase == (RegVmRegister *)0x0) {
      dst_02 = (RegVmRegister *)(*(code *)NULLC::alloc)(0x42000);
      (this->vmState).regFileArrayBase = dst_02;
      NULLC::fillMemory(dst_02,0,0x40000);
      (this->vmState).regFileArrayEnd = (this->vmState).regFileArrayBase + 0x8000;
    }
    mprotect((void *)(((ulong)(this->vmState).callStackEnd & 0xfffffffffffff000) + 0x1000),0x1000,0)
    ;
    mprotect((void *)(((ulong)(this->vmState).dataStackEnd & 0xfffffffffffff000) + 0x1000),0x1000,0)
    ;
    mprotect((void *)(((ulong)(this->vmState).regFileArrayEnd & 0xfffffffffffff000) + 0x1000),0x1000
             ,0);
    return true;
  }
  __assert_fail("pos <= codeLaunchHeader + codeLaunchHeaderSize",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_X86.cpp"
                ,0x291,"bool ExecutorX86::Initialize()");
}

Assistant:

bool ExecutorX86::Initialize()
{
	using namespace NULLC;

	cgFuncs[rviNop] = GenCodeCmdNop;
	cgFuncs[rviLoadByte] = GenCodeCmdLoadByte;
	cgFuncs[rviLoadWord] = GenCodeCmdLoadWord;
	cgFuncs[rviLoadDword] = GenCodeCmdLoadDword;
	cgFuncs[rviLoadLong] = GenCodeCmdLoadLong;
	cgFuncs[rviLoadFloat] = GenCodeCmdLoadFloat;
	cgFuncs[rviLoadDouble] = GenCodeCmdLoadDouble;
	cgFuncs[rviLoadImm] = GenCodeCmdLoadImm;
	cgFuncs[rviStoreByte] = GenCodeCmdStoreByte;
	cgFuncs[rviStoreWord] = GenCodeCmdStoreWord;
	cgFuncs[rviStoreDword] = GenCodeCmdStoreDword;
	cgFuncs[rviStoreLong] = GenCodeCmdStoreLong;
	cgFuncs[rviStoreFloat] = GenCodeCmdStoreFloat;
	cgFuncs[rviStoreDouble] = GenCodeCmdStoreDouble;
	cgFuncs[rviCombinedd] = GenCodeCmdCombinedd;
	cgFuncs[rviBreakupdd] = GenCodeCmdBreakupdd;
	cgFuncs[rviMov] = GenCodeCmdMov;
	cgFuncs[rviMovMult] = GenCodeCmdMovMult;
	cgFuncs[rviDtoi] = GenCodeCmdDtoi;
	cgFuncs[rviDtol] = GenCodeCmdDtol;
	cgFuncs[rviDtof] = GenCodeCmdDtof;
	cgFuncs[rviItod] = GenCodeCmdItod;
	cgFuncs[rviLtod] = GenCodeCmdLtod;
	cgFuncs[rviItol] = GenCodeCmdItol;
	cgFuncs[rviLtoi] = GenCodeCmdLtoi;
	cgFuncs[rviIndex] = GenCodeCmdIndex;
	cgFuncs[rviGetAddr] = GenCodeCmdGetAddr;
	cgFuncs[rviSetRange] = GenCodeCmdSetRange;
	cgFuncs[rviMemCopy] = GenCodeCmdMemCopy;
	cgFuncs[rviJmp] = GenCodeCmdJmp;
	cgFuncs[rviJmpz] = GenCodeCmdJmpz;
	cgFuncs[rviJmpnz] = GenCodeCmdJmpnz;
	cgFuncs[rviCall] = GenCodeCmdCall;
	cgFuncs[rviCallPtr] = GenCodeCmdCallPtr;
	cgFuncs[rviReturn] = GenCodeCmdReturn;
	cgFuncs[rviAddImm] = GenCodeCmdAddImm;
	cgFuncs[rviAdd] = GenCodeCmdAdd;
	cgFuncs[rviSub] = GenCodeCmdSub;
	cgFuncs[rviMul] = GenCodeCmdMul;
	cgFuncs[rviDiv] = GenCodeCmdDiv;
	cgFuncs[rviPow] = GenCodeCmdPow;
	cgFuncs[rviMod] = GenCodeCmdMod;
	cgFuncs[rviLess] = GenCodeCmdLess;
	cgFuncs[rviGreater] = GenCodeCmdGreater;
	cgFuncs[rviLequal] = GenCodeCmdLequal;
	cgFuncs[rviGequal] = GenCodeCmdGequal;
	cgFuncs[rviEqual] = GenCodeCmdEqual;
	cgFuncs[rviNequal] = GenCodeCmdNequal;
	cgFuncs[rviShl] = GenCodeCmdShl;
	cgFuncs[rviShr] = GenCodeCmdShr;
	cgFuncs[rviBitAnd] = GenCodeCmdBitAnd;
	cgFuncs[rviBitOr] = GenCodeCmdBitOr;
	cgFuncs[rviBitXor] = GenCodeCmdBitXor;
	cgFuncs[rviAddImml] = GenCodeCmdAddImml;
	cgFuncs[rviAddl] = GenCodeCmdAddl;
	cgFuncs[rviSubl] = GenCodeCmdSubl;
	cgFuncs[rviMull] = GenCodeCmdMull;
	cgFuncs[rviDivl] = GenCodeCmdDivl;
	cgFuncs[rviPowl] = GenCodeCmdPowl;
	cgFuncs[rviModl] = GenCodeCmdModl;
	cgFuncs[rviLessl] = GenCodeCmdLessl;
	cgFuncs[rviGreaterl] = GenCodeCmdGreaterl;
	cgFuncs[rviLequall] = GenCodeCmdLequall;
	cgFuncs[rviGequall] = GenCodeCmdGequall;
	cgFuncs[rviEquall] = GenCodeCmdEquall;
	cgFuncs[rviNequall] = GenCodeCmdNequall;
	cgFuncs[rviShll] = GenCodeCmdShll;
	cgFuncs[rviShrl] = GenCodeCmdShrl;
	cgFuncs[rviBitAndl] = GenCodeCmdBitAndl;
	cgFuncs[rviBitOrl] = GenCodeCmdBitOrl;
	cgFuncs[rviBitXorl] = GenCodeCmdBitXorl;
	cgFuncs[rviAddd] = GenCodeCmdAddd;
	cgFuncs[rviSubd] = GenCodeCmdSubd;
	cgFuncs[rviMuld] = GenCodeCmdMuld;
	cgFuncs[rviDivd] = GenCodeCmdDivd;
	cgFuncs[rviAddf] = GenCodeCmdAddf;
	cgFuncs[rviSubf] = GenCodeCmdSubf;
	cgFuncs[rviMulf] = GenCodeCmdMulf;
	cgFuncs[rviDivf] = GenCodeCmdDivf;
	cgFuncs[rviPowd] = GenCodeCmdPowd;
	cgFuncs[rviModd] = GenCodeCmdModd;
	cgFuncs[rviLessd] = GenCodeCmdLessd;
	cgFuncs[rviGreaterd] = GenCodeCmdGreaterd;
	cgFuncs[rviLequald] = GenCodeCmdLequald;
	cgFuncs[rviGequald] = GenCodeCmdGequald;
	cgFuncs[rviEquald] = GenCodeCmdEquald;
	cgFuncs[rviNequald] = GenCodeCmdNequald;
	cgFuncs[rviNeg] = GenCodeCmdNeg;
	cgFuncs[rviNegl] = GenCodeCmdNegl;
	cgFuncs[rviNegd] = GenCodeCmdNegd;
	cgFuncs[rviBitNot] = GenCodeCmdBitNot;
	cgFuncs[rviBitNotl] = GenCodeCmdBitNotl;
	cgFuncs[rviLogNot] = GenCodeCmdLogNot;
	cgFuncs[rviLogNotl] = GenCodeCmdLogNotl;
	cgFuncs[rviConvertPtr] = GenCodeCmdConvertPtr;

	// Create code launch header
	unsigned char *pos = codeLaunchHeader;

#if defined(_M_X64)
	// Save non-volatile registers
	pos += x86PUSH(pos, rRBP);
	pos += x86PUSH(pos, rRBX);
	pos += x86PUSH(pos, rRDI);
	pos += x86PUSH(pos, rRSI);
	pos += x86PUSH(pos, rR12);
	pos += x86PUSH(pos, rR13);
	pos += x86PUSH(pos, rR14);
	pos += x86PUSH(pos, rR15);
	pos += x64SUB(pos, rRSP, 40);

#ifndef __linux
	pos += x64MOV(pos, rRBX, rRDX);
#else
	pos += x64MOV(pos, rRBX, rRSI);
#endif

	pos += x64MOV(pos, rR13, uintptr_t(&vmState));
	pos += x86MOV(pos, rR15, sQWORD, rNONE, 1, rR13, nullcOffsetOf(&vmState, dataStackTop));
	pos += x86MOV(pos, rR14, sQWORD, rNONE, 1, rR13, nullcOffsetOf(&vmState, exRegVmConstants));
	pos += x86MOV(pos, rRAX, sQWORD, rNONE, 1, rR13, nullcOffsetOf(&vmState, dataStackBase));
	pos += x86MOV(pos, sQWORD, rNONE, 1, rRBX, 0, rRAX);

#ifndef __linux
	pos += x86CALL(pos, rECX);
#else
	pos += x86CALL(pos, rRDI);
#endif

	// Restore registers
	pos += x64ADD(pos, rRSP, 40);
	pos += x86POP(pos, rR15);
	pos += x86POP(pos, rR14);
	pos += x86POP(pos, rR13);
	pos += x86POP(pos, rR12);
	pos += x86POP(pos, rRSI);
	pos += x86POP(pos, rRDI);
	pos += x86POP(pos, rRBX);
	pos += x86POP(pos, rRBP);

	pos += x86RET(pos);
#else
	// Setup stack frame
	pos += x86PUSH(pos, rEBP);
	pos += x86MOV(pos, rEBP, rESP);

	// Save registers
	pos += x86PUSH(pos, rEBX);
	pos += x86PUSH(pos, rECX);
	pos += x86PUSH(pos, rESI);
	pos += x86PUSH(pos, rEDI);

	pos += x86MOV(pos, rEAX, sDWORD, rNONE, 0, rEBP, 8); // Get nullc code address
	pos += x86MOV(pos, rEBX, sDWORD, rNONE, 0, rEBP, 12); // Get register file

	pos += x86MOV(pos, rESI, sDWORD, rNONE, 0, rEBX, rvrrFrame * 8); // Get frame pointer

	// Go into nullc code
	pos += x86CALL(pos, rEAX);

	// Restore registers
	pos += x86POP(pos, rEDI);
	pos += x86POP(pos, rESI);
	pos += x86POP(pos, rECX);
	pos += x86POP(pos, rEBX);

	// Destroy stack frame
	pos += x86MOV(pos, rESP, rEBP);
	pos += x86POP(pos, rEBP);
	pos += x86RET(pos);
#endif

	assert(pos <= codeLaunchHeader + codeLaunchHeaderSize);
	codeLaunchHeaderLength = unsigned(pos - codeLaunchHeader);

	// Enable execution of code head
#ifndef __linux
	VirtualProtect((void*)codeLaunchHeader, codeLaunchHeaderSize, PAGE_EXECUTE_READWRITE, (DWORD*)&oldCodeLaunchHeaderProtect);

#if defined(_M_X64)
	pos += 16 - unsigned(uintptr_t(pos) % 16);

	codeLaunchUnwindOffset = unsigned(pos - codeLaunchHeader);

	assert(sizeof(UNWIND_CODE) == 2);
	assert(sizeof(UNWIND_INFO_ENTRY) == 4 + 10 * 2);

	UNWIND_INFO_ENTRY unwindInfo = { 0 };

	unwindInfo.version = 1;
	unwindInfo.flags = 0; // No EH
	unwindInfo.sizeOfProlog = 16;
	unwindInfo.countOfCodes = 9;
	unwindInfo.frameRegister = 0;
	unwindInfo.frameOffset = 0;

	unwindInfo.unwindCode[0].offsetInPrologue = 16;
	unwindInfo.unwindCode[0].operationCode = UWOP_ALLOC_SMALL;
	unwindInfo.unwindCode[0].operationInfo = (40 - 8) / 8;

	unwindInfo.unwindCode[1].offsetInPrologue = 12;
	unwindInfo.unwindCode[1].operationCode = UWOP_PUSH_NONVOL;
	unwindInfo.unwindCode[1].operationInfo = 15; // r15

	unwindInfo.unwindCode[2].offsetInPrologue = 10;
	unwindInfo.unwindCode[2].operationCode = UWOP_PUSH_NONVOL;
	unwindInfo.unwindCode[2].operationInfo = 14; // r14

	unwindInfo.unwindCode[3].offsetInPrologue = 8;
	unwindInfo.unwindCode[3].operationCode = UWOP_PUSH_NONVOL;
	unwindInfo.unwindCode[3].operationInfo = 13; // r13

	unwindInfo.unwindCode[4].offsetInPrologue = 6;
	unwindInfo.unwindCode[4].operationCode = UWOP_PUSH_NONVOL;
	unwindInfo.unwindCode[4].operationInfo = 12; // r12

	unwindInfo.unwindCode[5].offsetInPrologue = 4;
	unwindInfo.unwindCode[5].operationCode = UWOP_PUSH_NONVOL;
	unwindInfo.unwindCode[5].operationInfo = UWOP_REGISTER_RSI;

	unwindInfo.unwindCode[6].offsetInPrologue = 3;
	unwindInfo.unwindCode[6].operationCode = UWOP_PUSH_NONVOL;
	unwindInfo.unwindCode[6].operationInfo = UWOP_REGISTER_RDI;

	unwindInfo.unwindCode[7].offsetInPrologue = 2;
	unwindInfo.unwindCode[7].operationCode = UWOP_PUSH_NONVOL;
	unwindInfo.unwindCode[7].operationInfo = UWOP_REGISTER_RBX;

	unwindInfo.unwindCode[8].offsetInPrologue = 1;
	unwindInfo.unwindCode[8].operationCode = UWOP_PUSH_NONVOL;
	unwindInfo.unwindCode[8].operationInfo = UWOP_REGISTER_RBP;

	NULLC::copyMemory(pos, &unwindInfo, sizeof(unwindInfo));
	pos += sizeof(unwindInfo);

	assert(pos <= codeLaunchHeader + codeLaunchHeaderSize);

	uintptr_t baseAddress = (uintptr_t)codeLaunchHeader;

	codeLaunchWin64UnwindTable = (RUNTIME_FUNCTION*)NULLC::alloc(sizeof(RUNTIME_FUNCTION) * 1);

	codeLaunchWin64UnwindTable[0].BeginAddress = 0;
	codeLaunchWin64UnwindTable[0].EndAddress = codeLaunchHeaderLength;
	codeLaunchWin64UnwindTable[0].UnwindData = codeLaunchUnwindOffset;

	// Can't get RtlInstallFunctionTableCallback to work (it's not getting called)

	if(!RtlAddFunctionTable(codeLaunchWin64UnwindTable, 1, baseAddress))
		printf("Failed to install function table");
#endif

	codeLaunchDataLength = unsigned(pos - codeLaunchHeader);

#else
	NULLC::MemProtect((void*)codeLaunchHeader, codeLaunchHeaderSize, PROT_READ | PROT_WRITE | PROT_EXEC);
#endif

	if(!vmState.callStackBase)
	{
		vmState.callStackBase = (CodeGenRegVmCallStackEntry*)NULLC::alloc(sizeof(CodeGenRegVmCallStackEntry) * 1024 * 2 + 8192); // Two extra pages for page guard
		NULLC::fillMemory(vmState.callStackBase, 0, sizeof(CodeGenRegVmCallStackEntry) * 1024 * 2);
		vmState.callStackEnd = vmState.callStackBase + 1024 * 2;
	}

	if(!vmState.tempStackArrayBase)
	{
		vmState.tempStackArrayBase = (unsigned*)NULLC::alloc(sizeof(unsigned) * 1024 * 16);
		NULLC::fillMemory(vmState.tempStackArrayBase, 0, sizeof(unsigned) * 1024 * 16);
		vmState.tempStackArrayEnd = vmState.tempStackArrayBase + 1024 * 16;
	}

	if(!vmState.dataStackBase)
	{
		vmState.dataStackBase = (char*)NULLC::alloc(sizeof(char) * minStackSize + 8192); // Two extra pages for page guard
		NULLC::fillMemory(vmState.dataStackBase, 0, sizeof(char) * minStackSize);
		vmState.dataStackEnd = vmState.dataStackBase + minStackSize;
	}

	if(!vmState.regFileArrayBase)
	{
		vmState.regFileArrayBase = (RegVmRegister*)NULLC::alloc(sizeof(RegVmRegister) * 1024 * 32 + 8192); // Two extra pages for page guard
		NULLC::fillMemory(vmState.regFileArrayBase, 0, sizeof(RegVmRegister) * 1024 * 32);
		vmState.regFileArrayEnd = vmState.regFileArrayBase + 1024 * 32;
	}

	NULLC::DenyMemoryPageRead(vmState.callStackEnd);
	NULLC::DenyMemoryPageRead(vmState.dataStackEnd);
	NULLC::DenyMemoryPageRead(vmState.regFileArrayEnd);

	//x86TestEncoding(codeLaunchHeader);

	return true;
}